

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditions.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
          (LogEveryNSecState *this,double seconds)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  
  (this->counter_).super___atomic_base<unsigned_int>._M_i =
       (this->counter_).super___atomic_base<unsigned_int>._M_i + 1;
  if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
    lVar1 = rdtsc();
  }
  else {
    lVar1 = (*base_internal::CycleClock::cycle_clock_source_)();
  }
  lVar1 = lVar1 >> 2;
  lVar3 = (this->next_log_time_cycles_).super___atomic_base<long>._M_i;
  if (lVar3 < lVar1) {
    do {
      dVar5 = base_internal::UnscaledCycleClock::Frequency();
      LOCK();
      lVar2 = (this->next_log_time_cycles_).super___atomic_base<long>._M_i;
      bVar4 = lVar3 == lVar2;
      if (bVar4) {
        (this->next_log_time_cycles_).super___atomic_base<long>._M_i =
             (long)(dVar5 * 0.25 * seconds + (double)lVar1);
        lVar2 = lVar3;
      }
      UNLOCK();
    } while ((!bVar4) && (lVar3 = lVar2, lVar2 < lVar1));
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool LogEveryNSecState::ShouldLog(double seconds) {
  using absl::base_internal::CycleClock;
  LossyIncrement(&counter_);
  const int64_t now_cycles = CycleClock::Now();
  int64_t next_cycles = next_log_time_cycles_.load(std::memory_order_relaxed);
#if defined(__myriad2__)
  // myriad2 does not have 8-byte compare and exchange.  Use a racy version that
  // is "good enough" but will over-log in the face of concurrent logging.
  if (now_cycles > next_cycles) {
    next_log_time_cycles_.store(now_cycles + seconds * CycleClock::Frequency(),
                                std::memory_order_relaxed);
    return true;
  }
  return false;
#else
  do {
    if (now_cycles <= next_cycles) return false;
  } while (!next_log_time_cycles_.compare_exchange_weak(
      next_cycles, now_cycles + seconds * CycleClock::Frequency(),
      std::memory_order_relaxed, std::memory_order_relaxed));
  return true;
#endif
}